

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.cpp
# Opt level: O3

size_t eastl::RBTreeGetBlackCount(rbtree_node_base *pNodeTop,rbtree_node_base *pNodeBottom)

{
  size_t sVar1;
  
  sVar1 = 0;
  for (; (pNodeBottom != (rbtree_node_base *)0x0 &&
         (sVar1 = (pNodeBottom->mColor == '\x01') + sVar1, pNodeBottom != pNodeTop));
      pNodeBottom = pNodeBottom->mpNodeParent) {
  }
  return sVar1;
}

Assistant:

EASTL_API size_t RBTreeGetBlackCount(const rbtree_node_base* pNodeTop, const rbtree_node_base* pNodeBottom)
    {
        size_t nCount = 0;

        for(; pNodeBottom; pNodeBottom = pNodeBottom->mpNodeParent)
        {
            if(pNodeBottom->mColor == kRBTreeColorBlack) 
                ++nCount;

            if(pNodeBottom == pNodeTop) 
                break;
        }

        return nCount;
    }